

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.hpp
# Opt level: O3

void RadianceTexture(void)

{
  undefined1 auVar1 [16];
  double dVar2;
  uint uVar3;
  clock_t cVar4;
  uint uVar5;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Vector radiance;
  Random local_e8;
  Vector local_d0;
  double local_b8;
  double dStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  undefined8 uStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  undefined1 local_68 [40];
  double local_40;
  
  if (0 < height) {
    iVar6 = 0;
    local_b8 = 0.0;
    dStack_b0 = 1.0;
    do {
      iVar7 = height;
      cVar4 = clock();
      uVar3 = (int)cVar4 * iVar7 + iVar6;
      uVar5 = uVar3 / 0x7fffffff << 0x1f | uVar3 / 0x7fffffff;
      local_e8._gen._M_x = (unsigned_long)(uVar5 + uVar3 + (uint)(uVar3 + uVar5 == 0));
      local_e8._dist._M_param._M_a = local_b8;
      local_e8._dist._M_param._M_b = dStack_b0;
      if (0 < width) {
        local_a8 = ZEXT416((uint)(float)iVar6);
        iVar7 = 0;
        iVar8 = -1;
        do {
          iVar9 = (width + iVar8) * height + iVar6;
          local_78 = std::
                     generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                               (&local_e8._gen);
          local_88 = local_e8._dist._M_param._M_a;
          dStack_80 = local_e8._dist._M_param._M_b;
          local_98 = local_e8._dist._M_param._M_b;
          uStack_90 = 0;
          dVar10 = std::
                   generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                             (&local_e8._gen);
          auVar11._0_4_ = (float)(local_78 * (local_98 - local_88) + local_88) + (float)iVar7;
          auVar11._4_4_ =
               (float)(dVar10 * (local_e8._dist._M_param._M_b - local_e8._dist._M_param._M_a) +
                      local_e8._dist._M_param._M_a) + (float)local_a8._0_4_;
          auVar11._8_4_ = 0;
          auVar11._12_4_ = (float)local_a8._4_4_ + 0.0;
          auVar12._4_4_ = (float)height;
          auVar12._0_4_ = (float)width;
          auVar12._8_8_ = 0;
          auVar12 = divps(auVar11,auVar12);
          dVar10 = (double)auVar12._0_4_ + -0.5;
          dVar2 = (double)auVar12._4_4_ + -0.5;
          local_40 = cy.z * dVar2 + cx.z * dVar10 + cam.d.z;
          local_68._16_8_ = cam.o.z;
          local_68._0_8_ = cam.o.x;
          local_68._8_8_ = cam.o.y;
          auVar13._0_8_ = cam.d.x + dVar2 * cy.x + dVar10 * cx.x;
          auVar13._8_8_ = cam.d.y + dVar2 * cy.y + dVar10 * cx.y;
          dVar10 = SQRT(local_40 * local_40 +
                        auVar13._0_8_ * auVar13._0_8_ + auVar13._8_8_ * auVar13._8_8_);
          local_40 = local_40 / dVar10;
          auVar1._8_4_ = SUB84(dVar10,0);
          auVar1._0_8_ = dVar10;
          auVar1._12_4_ = (int)((ulong)dVar10 >> 0x20);
          local_68._24_16_ = divpd(auVar13,auVar1);
          Radiance(&local_d0,&spheres,(Ray *)local_68,&local_e8,0,1);
          bcg_img[iVar9] =
               (float)(((local_d0.x + local_d0.y + local_d0.z) / 3.0 +
                       (double)((float)nPasses * bcg_img[iVar9])) / (double)(nPasses + 1));
          iVar7 = iVar7 + 1;
          iVar8 = iVar8 + -1;
        } while (iVar7 < width);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < height);
  }
  nPasses = nPasses + 1;
  return;
}

Assistant:

void RadianceTexture() {

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   #pragma omp parallel for schedule(dynamic, 1)
   for (int y=0; y<height; y++){
      Random rng(y + height*clock());

      for (int x=0; x<width; x++) {
         int i=(width-x-1)*height+y;

         // Create the RNG and get the sub-pixel sample
         float dx = rng();
         float dy = rng();

         // Generate the pixel direction
         Vector d = cx*((dx + x)/float(width)  - .5) +
                    cy*((dy + y)/float(height) - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         Vector radiance = Radiance(spheres, ray, rng, 0, 1);

         bcg_img[i] = (float(nPasses)*bcg_img[i] + Vector::Dot(radiance, Vector(1,1,1))/3.0f) / float(nPasses+1);
      }
   }

   ++nPasses;
}